

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::EnumDescriptorProto::~EnumDescriptorProto(EnumDescriptorProto *this)

{
  EnumDescriptorProto *in_RDI;
  
  ~EnumDescriptorProto(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

EnumDescriptorProto::~EnumDescriptorProto() {
  // @@protoc_insertion_point(destructor:google.protobuf.EnumDescriptorProto)
  SharedDtor();
}